

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsClosed(ON_NurbsSurface *this,int dir)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double *pointA;
  double *pdVar4;
  double *corners [4];
  bool bIsClosed;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  corners[3]._3_1_ = 0;
  if (((-1 < dir) && (dir < 2)) && (0 < this->m_dim)) {
    corners[3]._4_4_ = dir;
    bVar1 = ON_IsKnotVectorClamped(this->m_order[dir],this->m_cv_count[dir],this->m_knot[dir],2);
    if (bVar1) {
      pointA = CV(this,0,0);
      pdVar4 = CV(this,this->m_cv_count[0] + -1,0);
      iVar2 = 2;
      if (corners[3]._4_4_ == 0) {
        iVar2 = 1;
      }
      corners[(long)iVar2 + -1] = pdVar4;
      pdVar4 = CV(this,0,this->m_cv_count[1] + -1);
      iVar2 = 1;
      if (corners[3]._4_4_ == 0) {
        iVar2 = 2;
      }
      corners[(long)iVar2 + -1] = pdVar4;
      corners[2] = CV(this,this->m_cv_count[0] + -1,this->m_cv_count[1] + -1);
      bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,corners[0]);
      if (((bVar1) &&
          (bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,corners[1],corners[2]),
          bVar1)) &&
         (bVar1 = ON_IsPointGridClosed
                            (this->m_dim,this->m_is_rat != 0,this->m_cv_count[0],this->m_cv_count[1]
                             ,this->m_cv_stride[0],this->m_cv_stride[1],this->m_cv,corners[3]._4_4_)
         , bVar1)) {
        corners[3]._3_1_ = 1;
      }
    }
    else {
      uVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x31])
                        (this,(ulong)corners[3]._4_4_);
      if ((uVar3 & 1) != 0) {
        corners[3]._3_1_ = 1;
      }
    }
  }
  return (bool)(corners[3]._3_1_ & 1);
}

Assistant:

bool 
ON_NurbsSurface::IsClosed( int dir ) const
{
  bool bIsClosed = false;
  if ( dir >= 0 && dir <= 1 && m_dim > 0 )
  {
    if ( ON_IsKnotVectorClamped( m_order[dir], m_cv_count[dir], m_knot[dir] ) )
    {
      const double* corners[4];
      corners[0] = CV(0,0);
      corners[(0==dir)?1:2] = CV(m_cv_count[0]-1,0);
      corners[(0==dir)?2:1] = CV(0,m_cv_count[1]-1);
      corners[3] = CV(m_cv_count[0]-1,m_cv_count[1]-1);
      if (    ON_PointsAreCoincident(m_dim,m_is_rat,corners[0],corners[1])
           && ON_PointsAreCoincident(m_dim,m_is_rat,corners[2],corners[3])
           && ON_IsPointGridClosed( m_dim, m_is_rat, m_cv_count[0], m_cv_count[1], m_cv_stride[0], m_cv_stride[1], m_cv, dir ) 
         )
      {
        bIsClosed = true;
      }
    }
    else if ( IsPeriodic(dir) )
    {
      bIsClosed = true;
    }
  }
  return bIsClosed;
}